

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O1

void __thiscall
firmata::FirmataMarshaller::sendDigital(FirmataMarshaller *this,uint8_t pin,uint8_t value)

{
  Stream *pSVar1;
  int iVar2;
  int *piVar3;
  
  pSVar1 = this->FirmataStream;
  if (pSVar1 != (Stream *)0x0) {
    iVar2 = (*pSVar1->_vptr_Stream[6])(pSVar1,0xf5);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,(ulong)(pin & 0x7f));
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,(ulong)(value != '\0'));
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
  }
  return;
}

Assistant:

void FirmataMarshaller::sendDigital(uint8_t pin, uint8_t value)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  FirmataStream->write(SET_DIGITAL_PIN_VALUE);
  FirmataStream->write(pin & 0x7F);
  FirmataStream->write(value != 0);
}